

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::ValueTranslator::matchesType
          (ValueTranslator *this,Reader src,Type type,Orphan<capnp::DynamicValue> *result)

{
  uint8_t uVar1;
  ushort uVar2;
  ulong uVar3;
  uint64_t uVar4;
  Schema SVar5;
  anon_union_2_2_d12d5221_for_Type_3 aVar6;
  ulong uVar7;
  Which WVar8;
  bool bVar9;
  byte bVar10;
  StringPtr message;
  StringPtr message_00;
  ReaderFor<DynamicEnum> RVar11;
  Type type_local;
  Fault f;
  OrphanBuilder local_c0;
  RawBrandedSchema *local_90;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_88;
  Type local_80;
  RawBrandedSchema *local_70;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_68;
  
  type_local.field_4 = type.field_4;
  uVar3 = type._0_8_;
  type_local._0_8_ = uVar3;
  if (ANY_POINTER < result->type) {
switchD_0015c341_caseD_0:
    kj::_::unreachable();
  }
  uVar1 = type.listDepth;
  WVar8 = type.baseType;
  switch(result->type) {
  case UNKNOWN:
    goto switchD_0015c341_caseD_0;
  case VOID:
    bVar9 = WVar8 == VOID;
    break;
  case BOOL:
    bVar9 = WVar8 == BOOL;
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,result);
    uVar3 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (-1 < (long)uVar3) {
      uVar3 = type_local._0_8_ & 0xffff;
      uVar1 = type_local.listDepth;
      goto switchD_0015c341_caseD_4;
    }
    WVar8 = LIST;
    if (type_local.listDepth == '\0') {
      WVar8 = type_local.baseType;
    }
    bVar10 = 0;
    switch(WVar8) {
    case INT8:
      uVar7 = 0xffffffffffffff80;
      break;
    case INT16:
      uVar7 = 0xffffffffffff8000;
      break;
    case INT32:
      uVar7 = 0xffffffff80000000;
      break;
    case INT64:
    case FLOAT32:
    case FLOAT64:
      goto switchD_0015c617_caseD_5;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      goto LAB_0015c63e;
    default:
      goto switchD_0015c617_default;
    }
    bVar10 = 1;
    if (uVar3 < uVar7) {
LAB_0015c63e:
      message_00.content.size_ = 0x1c;
      message_00.content.ptr = "Integer value out of range.";
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (this->errorReporter,&src,message_00);
      f.exception._0_4_ = 3;
      local_c0.tag.content = 0;
      local_c0.segment = (SegmentBuilder *)0x0;
      local_c0.capTable = (CapTableBuilder *)0x0;
      local_c0.location = (word *)0x0;
      Orphan<capnp::DynamicValue>::operator=(result,(Orphan<capnp::DynamicValue> *)&f);
      capnp::_::OrphanBuilder::~OrphanBuilder(&local_c0);
switchD_0015c617_caseD_5:
      bVar10 = 1;
    }
    goto switchD_0015c617_default;
  case UINT:
switchD_0015c341_caseD_4:
    uVar2 = 0xc;
    if (uVar1 == '\0') {
      uVar2 = (short)uVar3 - 2;
    }
    if (uVar2 < 10) {
      uVar3 = *(ulong *)(&DAT_001f4c10 + (ulong)uVar2 * 8);
      Orphan<capnp::DynamicValue>::getReader((Reader *)&f,result);
      uVar4 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
      DynamicValue::Reader::~Reader((Reader *)&f);
      bVar10 = 1;
      if (uVar3 < uVar4) {
        message.content.size_ = 0x1c;
        message.content.ptr = "Integer value out of range.";
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                  (this->errorReporter,&src,message);
        f.exception._0_4_ = 4;
        local_c0.tag.content = 0;
        local_c0.segment = (SegmentBuilder *)0x0;
        local_c0.capTable = (CapTableBuilder *)0x0;
        local_c0.location = (word *)0x0;
        Orphan<capnp::DynamicValue>::operator=(result,(Orphan<capnp::DynamicValue> *)&f);
        capnp::_::OrphanBuilder::~OrphanBuilder(&local_c0);
      }
      goto switchD_0015c617_default;
    }
    goto LAB_0015c496;
  case FLOAT:
    bVar10 = 1;
    if (WVar8 != FLOAT32 || uVar1 != '\0') {
      bVar10 = WVar8 == FLOAT64 && uVar1 == '\0';
    }
    goto switchD_0015c617_default;
  case TEXT:
    bVar9 = WVar8 == TEXT;
    break;
  case DATA:
    bVar9 = WVar8 == DATA;
    break;
  case LIST:
    if (uVar1 == '\0') {
      bVar10 = 0;
      if (WVar8 == ANY_POINTER) {
        aVar6.paramIndex = type.field_3.paramIndex;
        if (type_local.field_4.schema != (RawBrandedSchema *)0x0) {
          aVar6.paramIndex = 0;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          aVar6.paramIndex = 0;
        }
        if (3 < aVar6.paramIndex) goto switchD_0015c341_caseD_0;
        bVar10 = (byte)aVar6.paramIndex ^ 1;
      }
      goto switchD_0015c617_default;
    }
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_70,(Reader *)&f);
    local_90 = local_70;
    aStack_88 = aStack_68;
    local_80 = (Type)Type::asList(&type_local);
    bVar10 = Type::operator==((Type *)&local_90,&local_80);
    goto LAB_0015c560;
  case ENUM:
    if (uVar1 == '\0' && WVar8 == ENUM) {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&f,result);
      RVar11 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f)
      ;
      local_70 = (RawBrandedSchema *)RVar11.schema.super_Schema.raw;
      SVar5.raw = (RawBrandedSchema *)Type::asEnum(&type_local);
      goto LAB_0015c559;
    }
LAB_0015c496:
    bVar10 = 0;
    goto switchD_0015c617_default;
  case STRUCT:
    if (uVar1 != '\0' || WVar8 != STRUCT) {
      bVar10 = 0;
      if (WVar8 == ANY_POINTER && uVar1 == '\0') {
        aVar6.paramIndex = type.field_3.paramIndex;
        if (type_local.field_4.schema != (RawBrandedSchema *)0x0) {
          aVar6.paramIndex = 0;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          aVar6.paramIndex = 0;
        }
        if (3 < aVar6.paramIndex) goto switchD_0015c341_caseD_0;
        bVar10 = 3 >> ((byte)aVar6.paramIndex & 0xf);
      }
      goto switchD_0015c617_default;
    }
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_70,(Reader *)&f);
    SVar5.raw = (RawBrandedSchema *)Type::asStruct(&type_local);
LAB_0015c559:
    bVar10 = local_70 == SVar5.raw;
LAB_0015c560:
    DynamicValue::Reader::~Reader((Reader *)&f);
    goto switchD_0015c617_default;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7e7,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7ea,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f);
  }
  bVar10 = uVar1 == '\0' & bVar9;
switchD_0015c617_default:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ValueTranslator::matchesType(Expression::Reader src, Type type, Orphan<DynamicValue>& result) {
  // compileValueInner() evaluated `src` and only used `type` as a hint in interpreting `src` if
  // `src`'s type wasn't already obvious. So, now we need to check that the resulting value
  // actually matches `type`.

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      KJ_UNREACHABLE;

    case DynamicValue::VOID:
      return type.isVoid();

    case DynamicValue::BOOL:
      return type.isBool();

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: return false;
        }

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return true;
      }

    } KJ_FALLTHROUGH;  // value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: return false;
      }

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return true;
    }

    case DynamicValue::FLOAT:
      return type.isFloat32() || type.isFloat64();

    case DynamicValue::TEXT:
      return type.isText();

    case DynamicValue::DATA:
      return type.isData();

    case DynamicValue::LIST:
      if (type.isList()) {
        return result.getReader().as<DynamicList>().getSchema() == type.asList();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return true;
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::ENUM:
      return type.isEnum() &&
             result.getReader().as<DynamicEnum>().getSchema() == type.asEnum();

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        return result.getReader().as<DynamicStruct>().getSchema() == type.asStruct();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return true;
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  KJ_UNREACHABLE;
}